

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

essential_t *
opengv::relative_pose::eightpt
          (RelativeAdapterBase *adapter,vector<int,_std::allocator<int>_> *indices)

{
  Indices *in_RDI;
  Indices idx;
  Indices *in_stack_000009b0;
  RelativeAdapterBase *in_stack_000009b8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  
  Indices::Indices(in_RDI,in_stack_ffffffffffffffb8);
  eightpt(in_stack_000009b8,in_stack_000009b0);
  return (essential_t *)in_RDI;
}

Assistant:

opengv::essential_t
opengv::relative_pose::eightpt(
    const RelativeAdapterBase & adapter,
    const std::vector<int> & indices )
{
  Indices idx(indices);
  return eightpt(adapter,idx);
}